

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_get_archive_comment.c
# Opt level: O0

char * zip_get_archive_comment(zip_t *za,int *lenp,zip_flags_t flags)

{
  zip_uint8_t *str;
  zip_string_t *pzStack_30;
  zip_uint32_t len;
  zip_string_t *comment;
  int *piStack_20;
  zip_flags_t flags_local;
  int *lenp_local;
  zip_t *za_local;
  
  if (((flags & 8) == 0) && (za->comment_changes != (zip_string_t *)0x0)) {
    pzStack_30 = za->comment_changes;
  }
  else {
    pzStack_30 = za->comment_orig;
  }
  comment._4_4_ = flags;
  piStack_20 = lenp;
  lenp_local = (int *)za;
  za_local = (zip_t *)_zip_string_get(pzStack_30,(zip_uint32_t *)((long)&str + 4),flags,&za->error);
  if (za_local == (zip_t *)0x0) {
    za_local = (zip_t *)0x0;
  }
  else if (piStack_20 != (int *)0x0) {
    *piStack_20 = str._4_4_;
  }
  return (char *)za_local;
}

Assistant:

ZIP_EXTERN const char *
zip_get_archive_comment(zip_t *za, int *lenp, zip_flags_t flags) {
    zip_string_t *comment;
    zip_uint32_t len;
    const zip_uint8_t *str;

    if ((flags & ZIP_FL_UNCHANGED) || (za->comment_changes == NULL))
        comment = za->comment_orig;
    else
        comment = za->comment_changes;

    if ((str = _zip_string_get(comment, &len, flags, &za->error)) == NULL)
        return NULL;

    if (lenp)
        *lenp = (int)len;

    return (const char *)str;
}